

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O0

path * __thiscall StringLiteral::path(path *__return_storage_ptr__,StringLiteral *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  StringLiteral *this_local;
  
  ghc::filesystem::u8path<std::__cxx11::string,ghc::filesystem::path>
            (__return_storage_ptr__,(filesystem *)this,in_RDX);
  return __return_storage_ptr__;
}

Assistant:

fs::path path() const
	{
		return fs::u8path(_value);
	}